

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAlignedObjectArray.h
# Opt level: O2

void __thiscall
cbtAlignedObjectArray<ChUll_*>::~cbtAlignedObjectArray(cbtAlignedObjectArray<ChUll_*> *this)

{
  clear(this);
  return;
}

Assistant:

~cbtAlignedObjectArray()
	{
		clear();
	}